

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O0

void __thiscall chatra::TemporaryObject::setSelf(TemporaryObject *this,Reference targetRef)

{
  TemporaryObject *this_local;
  Reference targetRef_local;
  
  this->type = Self;
  this_local = (TemporaryObject *)targetRef.node;
  Reference::operator=(&this->targetRef,(Reference *)&this_local);
  clearRestrictions(this);
  return;
}

Assistant:

void TemporaryObject::setSelf(Reference targetRef) {
	type = Type::Self;
	this->targetRef = targetRef;
	clearRestrictions();
}